

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O3

vector sptk::swipe::swipe(vector<double,_std::allocator<double>_> *waveform,double samplerate,
                         double min,double max,double st,double dt)

{
  pointer pdVar1;
  bool bVar2;
  double dVar3;
  vector fERBs;
  vector fERBs_00;
  vector d;
  vector d_00;
  vector d_01;
  intvector ws;
  intvector ws_00;
  intvector ps;
  intvector ps_00;
  intvector ps_01;
  uint uVar4;
  uint xSz;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int n;
  int iVar9;
  int n_00;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  double *extraout_RDX_02;
  double *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 in_R8;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double nyquist;
  intvector iVar20;
  vector vVar21;
  matrix S;
  vector vVar22;
  intvector ones;
  vector yr_vector;
  intvector yr_vector_00;
  intvector yr_vector_01;
  vector yr_vector_02;
  vector yr_vector_03;
  vector yr_vector_04;
  matrix yr_matrix;
  vector x;
  vector x_00;
  vector x_01;
  vector pc;
  vector pc_00;
  vector pc_01;
  vector pc_02;
  double local_190;
  double local_178;
  double **local_120;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  int *piVar10;
  double *pdVar11;
  double *extraout_RDX;
  double **extraout_RDX_05;
  
  nyquist = samplerate * 0.5;
  local_190 = max;
  if (nyquist < max) {
    swipe((swipe *)waveform);
    local_190 = nyquist;
  }
  dVar19 = samplerate * 8.0;
  if (samplerate < dt) {
    fprintf(_stderr,"Timestep > SR...timestep set to %f.\n");
    dt = samplerate;
  }
  dVar16 = log(dVar19 / min);
  dVar3 = log(dVar19 / local_190);
  auVar17._8_8_ = dVar3;
  auVar17._0_8_ = dVar16;
  auVar17 = divpd(auVar17,_DAT_0012b220);
  dVar16 = auVar17._0_8_ - auVar17._8_8_;
  dVar16 = floor(dVar16 + *(double *)(&DAT_0012b200 + (ulong)(dVar16 < 0.0) * 8));
  iVar20 = makeiv((int)(dVar16 + 1.0));
  piVar10 = iVar20.v;
  uVar4 = iVar20.x;
  if (0 < (int)uVar4) {
    uVar15 = 0;
    do {
      dVar16 = log(dVar19 / min);
      dVar16 = floor(dVar16 / 0.6931471805599453 +
                     *(double *)(&DAT_0012b200 + (ulong)(dVar16 / 0.6931471805599453 < 0.0) * 8));
      dVar16 = exp2(dVar16);
      dVar3 = exp2((double)(int)uVar15);
      piVar10[uVar15] = (int)(dVar16 / dVar3);
      uVar15 = uVar15 + 1;
    } while (uVar4 != uVar15);
  }
  dVar16 = log(local_190);
  dVar3 = log(min);
  auVar18._8_8_ = dVar3;
  auVar18._0_8_ = dVar16;
  auVar17 = divpd(auVar18,_DAT_0012b220);
  dVar16 = ceil((auVar17._0_8_ - auVar17._8_8_) / 0.0104167);
  vVar21 = makev((int)dVar16);
  pdVar11 = vVar21.v;
  xSz = vVar21.x;
  vVar21 = makev(xSz);
  pdVar12 = vVar21.v;
  uVar5 = vVar21.x;
  local_178 = 0.0;
  if (0 < (int)xSz) {
    uVar15 = (ulong)xSz;
    do {
      dVar16 = log(min);
      local_178 = (double)(int)(uVar15 - 1) * 0.0104167 + dVar16 / 0.6931471805599453;
      dVar16 = exp2(local_178);
      pdVar11[uVar15 - 1] = dVar16;
      dVar16 = log(dVar19 / (double)*piVar10);
      pdVar12[uVar15 - 1] = (local_178 + 1.0) - dVar16 / 0.6931471805599453;
      bVar2 = 1 < uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar2);
  }
  uVar7 = (uint)((ulong)((long)(waveform->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(waveform->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  vVar21 = makev(uVar7);
  pdVar13 = vVar21.v;
  uVar6 = vVar21.x;
  if (0 < (int)uVar7) {
    pdVar1 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = 0;
    do {
      pdVar13[uVar15] = pdVar1[uVar15] * 3.0517578125e-05;
      uVar15 = uVar15 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar15);
  }
  dVar19 = log10(nyquist / 229.0 + 1.0);
  dVar16 = exp2(local_178);
  dVar16 = log10((dVar16 * 0.25) / 229.0 + 1.0);
  dVar19 = ceil((dVar19 * 21.4 - dVar16 * 21.4) / 0.1);
  vVar21 = makev((int)dVar19);
  pdVar14 = vVar21.v;
  uVar7 = vVar21.x;
  dVar19 = log10((min * 0.25) / 229.0 + 1.0);
  if (0 < (int)uVar7) {
    uVar15 = 0;
    do {
      dVar16 = pow(10.0,((double)(int)uVar15 * 0.1 + dVar19 * 21.4) / 21.4);
      pdVar14[uVar15] = (dVar16 + -1.0) * 229.0;
      uVar15 = uVar15 + 1;
    } while (uVar7 != uVar15);
  }
  dVar19 = floor(pdVar14[(long)(int)uVar7 + -1] / *pdVar11 + -0.75);
  iVar20 = onesiv((int)dVar19);
  ones.v = iVar20.v;
  uVar8 = iVar20.x;
  ones._0_8_ = ones.v;
  sieve((swipe *)(ulong)uVar8,ones);
  *ones.v = 1;
  dVar19 = ceil(((double)(int)uVar6 / samplerate) / dt);
  S = zerom(xSz,(int)dVar19);
  ps._4_4_ = uStack_6c;
  ps.x = uVar8;
  iVar20._4_4_ = uStack_5c;
  iVar20.x = uVar4;
  d._4_4_ = uStack_4c;
  d.x = uVar5;
  vVar21._4_4_ = uStack_3c;
  vVar21.x = uVar7;
  x._4_4_ = 0;
  x.x = uVar6;
  vVar21.v = pdVar14;
  d.v = pdVar12;
  iVar20.v = piVar10;
  ps.v = ones.v;
  x.v = pdVar13;
  pc_00.v = pdVar11;
  pc_00._0_8_ = in_R8;
  Sfirst(S,x,pc_00,vVar21,d,iVar20,ps,nyquist,samplerate,dt,0);
  n = 1;
  local_120 = S.m;
  if (2 < (int)uVar4) {
    n = uVar4 - 1;
    n_00 = 1;
    do {
      ps_00._4_4_ = uStack_ac;
      ps_00.x = uVar8;
      ws._4_4_ = uStack_9c;
      ws.x = uVar4;
      d_00._4_4_ = uStack_8c;
      d_00.x = uVar5;
      fERBs._4_4_ = uStack_7c;
      fERBs.x = uVar7;
      x_00._4_4_ = 0;
      x_00.x = uVar6;
      fERBs.v = pdVar14;
      d_00.v = pdVar12;
      ws.v = piVar10;
      ps_00.v = ones.v;
      x_00.v = pdVar13;
      pc_01.v = pdVar11;
      pc_01._0_8_ = in_R8;
      Snth(S,x_00,pc_01,fERBs,d_00,ws,ps_00,nyquist,samplerate,dt,n_00);
      iVar9 = (2 - uVar4) + n_00;
      n_00 = n_00 + 1;
    } while (iVar9 != 0);
  }
  ps_01._4_4_ = uStack_ec;
  ps_01.x = uVar8;
  ws_00._4_4_ = uStack_dc;
  ws_00.x = uVar4;
  d_01._4_4_ = uStack_cc;
  d_01.x = uVar5;
  fERBs_00._4_4_ = uStack_bc;
  fERBs_00.x = uVar7;
  x_01._4_4_ = 0;
  x_01.x = uVar6;
  fERBs_00.v = pdVar14;
  d_01.v = pdVar12;
  ws_00.v = piVar10;
  ps_01.v = ones.v;
  x_01.v = pdVar13;
  pc_02.v = pdVar11;
  pc_02._0_8_ = in_R8;
  Slast(S,x_01,pc_02,fERBs_00,d_01,ws_00,ps_01,nyquist,samplerate,dt,n);
  yr_vector.v = extraout_RDX;
  yr_vector._0_8_ = pdVar14;
  freev((swipe *)(ulong)uVar7,yr_vector);
  yr_vector_00.v = extraout_RDX_00;
  yr_vector_00._0_8_ = piVar10;
  freeiv((swipe *)(ulong)uVar4,yr_vector_00);
  yr_vector_01.v = extraout_RDX_01;
  yr_vector_01._0_8_ = ones.v;
  freeiv((swipe *)(ulong)uVar8,yr_vector_01);
  yr_vector_02.v = extraout_RDX_02;
  yr_vector_02._0_8_ = pdVar12;
  freev((swipe *)(ulong)uVar5,yr_vector_02);
  yr_vector_03.v = extraout_RDX_03;
  yr_vector_03._0_8_ = pdVar13;
  freev((swipe *)(ulong)uVar6,yr_vector_03);
  pc.v = pdVar11;
  pc._0_8_ = extraout_RDX_04;
  vVar21 = pitch(S,pc,st);
  yr_vector_04.v = vVar21.v;
  vVar22.x = vVar21.x;
  yr_vector_04._0_8_ = pdVar11;
  freev((swipe *)(ulong)xSz,yr_vector_04);
  yr_matrix.m = extraout_RDX_05;
  yr_matrix._0_8_ = local_120;
  freem(S._0_8_,yr_matrix);
  vVar22._4_4_ = 0;
  vVar22.v = yr_vector_04.v;
  return vVar22;
}

Assistant:

vector swipe(const std::vector<double>& waveform, double samplerate, double min,
             double max, double st, double dt) {
#endif
    int i; 
    double td = 0.;
#if 0
    SF_INFO info;
    SNDFILE* source = sf_open_fd(fid, SFM_READ, &info, true);
    if (source == NULL || info.sections < 1) 
        return(makev(0)); 
    double nyquist = info.samplerate / 2.;
    double nyquist2 = info.samplerate;
    double nyquist16 = info.samplerate * 8.;
#else
    double nyquist = samplerate / 2.;
    double nyquist2 = samplerate;
    double nyquist16 = samplerate * 8.;
#endif
    if (max > nyquist) {
        max = nyquist;
        fprintf(stderr, "Max pitch exceeds Nyquist frequency...");
        fprintf(stderr, "max pitch set to %.2f Hz.\n", max);
    }
    if (dt > nyquist2) {
        dt = nyquist2;
        fprintf(stderr, "Timestep > SR...timestep set to %f.\n", nyquist2);
    }
    intvector ws = makeiv(round(log2((nyquist16) / min) -  
                                log2((nyquist16) / max)) + 1); 
    for (i = 0; i < ws.x; i++)
        ws.v[i] = pow(2, round(log2(nyquist16 / min))) / pow(2, i);
    vector pc = makev(ceil((log2(max) - log2(min)) / DLOG2P));
    vector d = makev(pc.x);
    for (i = pc.x - 1; i >= 0; i--) { 
        td = log2(min) + (i * DLOG2P);
        pc.v[i] = pow(2, td);
        d.v[i] = 1. + td - log2(nyquist16 / ws.v[0]); 
    } // td now equals log2(min)
#if 0
    vector x = makev((int) info.frames); // read in the signal
    sf_read_double(source, x.v, x.x);
    sf_close(source); // takes wavf with it, too
#else
    double n = 1. / 32768.;
    int frames = static_cast<int>(waveform.size());
    vector x = makev(frames);
    for (i = 0; i < frames; i++)
        x.v[i] = waveform[i] * n;
#endif
    vector fERBs = makev(ceil((hz2erb(nyquist) - 
                               hz2erb(pow(2, td) / 4)) / DERBS));
    td = hz2erb(min / 4.);
    for (i = 0; i < fERBs.x; i++) 
        fERBs.v[i] = erb2hz(td + (i * DERBS));
    intvector ps = onesiv(floor(fERBs.v[fERBs.x - 1] / pc.v[0] - .75));
    sieve(ps);
    ps.v[0] = PR; // hack to make 1 "act" prime...don't ask
    matrix S = zerom(pc.x, ceil(((double) x.x / nyquist2) / dt));
    Sfirst(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, 0); 
    for (i = 1; i < ws.x - 1; i++) // S is updated inline here
        Snth(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    // i is now (ws.x - 1)
    Slast(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    freev(fERBs); 
    freeiv(ws);
    freeiv(ps);
    freev(d);  
    freev(x);
    vector p = pitch(S, pc, st); // find pitch using strength matrix
    freev(pc);
    freem(S);
    return(p);
}